

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_aws_sigv4.c
# Opt level: O0

CURLcode Curl_output_aws_sigv4(Curl_easy *data,_Bool proxy)

{
  connectdata *conn_00;
  uchar *input;
  CURLcode CVar1;
  char *pcVar2;
  ulong uVar3;
  size_t sVar4;
  char *pcVar5;
  size_t sVar6;
  char *pcVar7;
  char *local_3d0;
  char *local_380;
  char *local_368;
  char *local_360;
  char *local_358;
  char *method;
  char *pcStack_348;
  Curl_HttpReq httpreq;
  char *hostreg;
  char *reg;
  char *hostdot;
  char *auth_headers;
  uchar sign1 [32];
  uchar sign0 [32];
  char *secret;
  char *user;
  char *str_to_sign;
  char *credential_scope;
  char *request_type;
  char *canonical_request;
  char sha_hex [65];
  uchar local_268 [8];
  uchar sha_hash [32];
  size_t local_240;
  size_t post_data_len;
  char *post_data;
  char *date_header;
  dynbuf signed_headers;
  dynbuf canonical_headers;
  char cStack_1e0;
  char cStack_1df;
  char cStack_1de;
  char cStack_1dd;
  char cStack_1dc;
  char cStack_1db;
  char cStack_1da;
  char date [9];
  char timestamp [17];
  tm tm;
  time_t clock;
  char *hostname;
  char service [65];
  uchar local_128 [8];
  char region [65];
  char local_d8 [8];
  char provider1 [65];
  char local_88 [8];
  char provider0 [65];
  char *arg;
  size_t len;
  connectdata *conn;
  CURLcode ret;
  _Bool proxy_local;
  Curl_easy *data_local;
  
  conn_00 = data->conn;
  memset(local_88,0,0x41);
  memset(local_d8,0,0x41);
  memset(local_128,0,0x41);
  memset(&hostname,0,0x41);
  pcVar7 = (conn_00->host).name;
  post_data = (char *)0x0;
  input = (uchar *)(data->set).postfields;
  local_240 = 0;
  request_type = (char *)0x0;
  credential_scope = (char *)0x0;
  str_to_sign = (char *)0x0;
  user = (char *)0x0;
  if ((data->state).aptr.user == (char *)0x0) {
    local_360 = "";
  }
  else {
    local_360 = (data->state).aptr.user;
  }
  sign0[0x18] = '\0';
  sign0[0x19] = '\0';
  sign0[0x1a] = '\0';
  sign0[0x1b] = '\0';
  sign0[0x1c] = '\0';
  sign0[0x1d] = '\0';
  sign0[0x1e] = '\0';
  sign0[0x1f] = '\0';
  memset(sign1 + 0x18,0,0x20);
  memset(&auth_headers,0,0x20);
  hostdot = (char *)0x0;
  pcVar2 = Curl_checkheaders(data,"Authorization",0xd);
  if (pcVar2 != (char *)0x0) {
    return CURLE_OK;
  }
  Curl_dyn_init((dynbuf *)&signed_headers.toobig,0x19000);
  Curl_dyn_init((dynbuf *)&date_header,0x19000);
  if ((data->set).str[0x4e] == (char *)0x0) {
    local_368 = "aws:amz";
  }
  else {
    local_368 = (data->set).str[0x4e];
  }
  __isoc99_sscanf(local_368,"%64[^:]:%64[^:]:%64[^:]:%64s",local_88,local_d8,local_128,&hostname);
  if (local_88[0] == '\0') {
    Curl_failf(data,"first provider can\'t be empty");
    conn._0_4_ = CURLE_BAD_FUNCTION_ARGUMENT;
    goto LAB_00a39faa;
  }
  if (local_d8[0] == '\0') {
    strcpy(local_d8,local_88);
  }
  if ((char)hostname == '\0') {
    reg = strchr(pcVar7,0x2e);
    if (reg == (char *)0x0) {
      Curl_failf(data,"service missing in parameters and hostname");
      conn._0_4_ = CURLE_URL_MALFORMAT;
      goto LAB_00a39faa;
    }
    uVar3 = (long)reg - (long)pcVar7;
    if (0x40 < uVar3) {
      Curl_failf(data,"service too long in hostname");
      conn._0_4_ = CURLE_URL_MALFORMAT;
      goto LAB_00a39faa;
    }
    strncpy((char *)&hostname,pcVar7,uVar3);
    service[uVar3 - 8] = '\0';
    if (local_128[0] == '\0') {
      hostreg = reg + 1;
      pcStack_348 = strchr(hostreg,0x2e);
      if (pcStack_348 == (char *)0x0) {
        Curl_failf(data,"region missing in parameters and hostname");
        conn._0_4_ = CURLE_URL_MALFORMAT;
        goto LAB_00a39faa;
      }
      uVar3 = (long)pcStack_348 - (long)hostreg;
      if (0x40 < uVar3) {
        Curl_failf(data,"region too long in hostname");
        conn._0_4_ = CURLE_URL_MALFORMAT;
        goto LAB_00a39faa;
      }
      strncpy((char *)local_128,hostreg,uVar3);
      local_128[uVar3] = '\0';
    }
  }
  time((time_t *)&tm.tm_zone);
  conn._0_4_ = Curl_gmtime((time_t)tm.tm_zone,(tm *)(timestamp + 0x10));
  if ((CURLcode)conn == CURLE_OK) {
    sVar4 = strftime(date + 1,0x11,"%Y%m%dT%H%M%SZ",(tm *)(timestamp + 0x10));
    if (sVar4 == 0) {
      conn._0_4_ = CURLE_OUT_OF_MEMORY;
    }
    else {
      conn._0_4_ = make_headers(data,pcVar7,date + 1,local_d8,&post_data,
                                (dynbuf *)&signed_headers.toobig,(dynbuf *)&date_header);
      if ((CURLcode)conn == CURLE_OK) {
        conn._0_4_ = CURLE_OUT_OF_MEMORY;
        canonical_headers.toobig._7_1_ = date[1];
        cStack_1e0 = date[2];
        cStack_1df = date[3];
        cStack_1de = date[4];
        cStack_1dd = date[5];
        cStack_1dc = date[6];
        cStack_1db = date[7];
        cStack_1da = date[8];
        date[0] = '\0';
        if (input != (uchar *)0x0) {
          if ((data->set).postfieldsize < 0) {
            local_240 = strlen((char *)input);
          }
          else {
            local_240 = (data->set).postfieldsize;
          }
        }
        CVar1 = Curl_sha256it(local_268,input,local_240);
        if (CVar1 == CURLE_OK) {
          sha256_to_hex((char *)&canonical_request,local_268,0x41);
          Curl_http_method(data,conn_00,&local_358,(Curl_HttpReq *)((long)&method + 4));
          pcVar7 = (data->state).up.path;
          if ((data->state).up.query == (char *)0x0) {
            local_380 = "";
          }
          else {
            local_380 = (data->state).up.query;
          }
          pcVar2 = Curl_dyn_ptr((dynbuf *)&signed_headers.toobig);
          pcVar5 = Curl_dyn_ptr((dynbuf *)&date_header);
          request_type = curl_maprintf("%s\n%s\n%s\n%s\n%s\n%s",local_358,pcVar7,local_380,pcVar2,
                                       pcVar5,&canonical_request);
          if ((uchar *)request_type != (uchar *)0x0) {
            sVar4 = strlen(local_88);
            Curl_strntolower(local_88,local_88,sVar4);
            credential_scope = curl_maprintf("%s4_request",local_88);
            if (((uchar *)credential_scope != (uchar *)0x0) &&
               (str_to_sign = curl_maprintf("%s/%s/%s/%s",
                                            (undefined1 *)((long)&canonical_headers.toobig + 7),
                                            local_128,&hostname,credential_scope),
               str_to_sign != (char *)0x0)) {
              sVar4 = strlen(request_type);
              CVar1 = Curl_sha256it(local_268,(uchar *)request_type,sVar4);
              if (CVar1 == CURLE_OK) {
                sha256_to_hex((char *)&canonical_request,local_268,0x41);
                sVar4 = strlen(local_88);
                Curl_strntoupper(local_88,local_88,sVar4);
                user = curl_maprintf("%s4-HMAC-SHA256\n%s\n%s\n%s",local_88,date + 1,str_to_sign,
                                     &canonical_request);
                if ((uchar *)user != (uchar *)0x0) {
                  if ((data->state).aptr.passwd == (char *)0x0) {
                    local_3d0 = "";
                  }
                  else {
                    local_3d0 = (data->state).aptr.passwd;
                  }
                  sign0._24_8_ = curl_maprintf("%s4%s",local_88,local_3d0);
                  if ((uchar *)sign0._24_8_ != (uchar *)0x0) {
                    sVar4 = strlen((char *)sign0._24_8_);
                    sVar6 = strlen((char *)((long)&canonical_headers.toobig + 7));
                    conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)sign0._24_8_,
                                             sVar4 & 0xffffffff,
                                             (uchar *)((long)&canonical_headers.toobig + 7),
                                             sVar6 & 0xffffffff,sign1 + 0x18);
                    if ((CURLcode)conn == CURLE_OK) {
                      sVar4 = strlen((char *)local_128);
                      conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,sign1 + 0x18,0x20,local_128,
                                               sVar4 & 0xffffffff,(uchar *)&auth_headers);
                      if ((CURLcode)conn == CURLE_OK) {
                        sVar4 = strlen((char *)&hostname);
                        conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&auth_headers,0x20,
                                                 (uchar *)&hostname,sVar4 & 0xffffffff,sign1 + 0x18)
                        ;
                        if ((CURLcode)conn == CURLE_OK) {
                          sVar4 = strlen(credential_scope);
                          conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,sign1 + 0x18,0x20,
                                                   (uchar *)credential_scope,sVar4 & 0xffffffff,
                                                   (uchar *)&auth_headers);
                          if ((CURLcode)conn == CURLE_OK) {
                            sVar4 = strlen(user);
                            conn._0_4_ = Curl_hmacit(Curl_HMAC_SHA256,(uchar *)&auth_headers,0x20,
                                                     (uchar *)user,sVar4 & 0xffffffff,sign1 + 0x18);
                            if ((CURLcode)conn == CURLE_OK) {
                              sha256_to_hex((char *)&canonical_request,sign1 + 0x18,0x41);
                              pcVar7 = Curl_dyn_ptr((dynbuf *)&date_header);
                              hostdot = curl_maprintf(
                                                  "Authorization: %s4-HMAC-SHA256 Credential=%s/%s, SignedHeaders=%s, Signature=%s\r\n%s\r\n"
                                                  ,local_88,local_360,str_to_sign,pcVar7,
                                                  &canonical_request,post_data);
                              if (hostdot != (char *)0x0) {
                                (*Curl_cfree)((data->state).aptr.userpwd);
                                (data->state).aptr.userpwd = (char *)0x0;
                                (data->state).aptr.userpwd = hostdot;
                                (data->state).authhost.field_0x18 =
                                     (data->state).authhost.field_0x18 & 0xfe | 1;
                                conn._0_4_ = CURLE_OK;
                              }
                            }
                          }
                        }
                      }
                    }
                  }
                }
              }
            }
          }
        }
      }
    }
  }
LAB_00a39faa:
  Curl_dyn_free((dynbuf *)&signed_headers.toobig);
  Curl_dyn_free((dynbuf *)&date_header);
  (*Curl_cfree)(request_type);
  (*Curl_cfree)(credential_scope);
  (*Curl_cfree)(str_to_sign);
  (*Curl_cfree)(user);
  (*Curl_cfree)((void *)sign0._24_8_);
  (*Curl_cfree)(post_data);
  return (CURLcode)conn;
}

Assistant:

CURLcode Curl_output_aws_sigv4(struct Curl_easy *data, bool proxy)
{
  CURLcode ret = CURLE_OUT_OF_MEMORY;
  struct connectdata *conn = data->conn;
  size_t len;
  const char *arg;
  char provider0[MAX_SIGV4_LEN + 1]="";
  char provider1[MAX_SIGV4_LEN + 1]="";
  char region[MAX_SIGV4_LEN + 1]="";
  char service[MAX_SIGV4_LEN + 1]="";
  const char *hostname = conn->host.name;
  time_t clock;
  struct tm tm;
  char timestamp[TIMESTAMP_SIZE];
  char date[9];
  struct dynbuf canonical_headers;
  struct dynbuf signed_headers;
  char *date_header = NULL;
  const char *post_data = data->set.postfields;
  size_t post_data_len = 0;
  unsigned char sha_hash[32];
  char sha_hex[65];
  char *canonical_request = NULL;
  char *request_type = NULL;
  char *credential_scope = NULL;
  char *str_to_sign = NULL;
  const char *user = data->state.aptr.user ? data->state.aptr.user : "";
  char *secret = NULL;
  unsigned char sign0[32] = {0};
  unsigned char sign1[32] = {0};
  char *auth_headers = NULL;

  DEBUGASSERT(!proxy);
  (void)proxy;

  if(Curl_checkheaders(data, STRCONST("Authorization"))) {
    /* Authorization already present, Bailing out */
    return CURLE_OK;
  }

  /* we init thoses buffers here, so goto fail will free initialized dynbuf */
  Curl_dyn_init(&canonical_headers, CURL_MAX_HTTP_HEADER);
  Curl_dyn_init(&signed_headers, CURL_MAX_HTTP_HEADER);

  /*
   * Parameters parsing
   * Google and Outscale use the same OSC or GOOG,
   * but Amazon uses AWS and AMZ for header arguments.
   * AWS is the default because most of non-amazon providers
   * are still using aws:amz as a prefix.
   */
  arg = data->set.str[STRING_AWS_SIGV4] ?
    data->set.str[STRING_AWS_SIGV4] : "aws:amz";

  /* provider1[:provider2[:region[:service]]]

     No string can be longer than N bytes of non-whitespace
   */
  (void)sscanf(arg, "%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "[^:]"
               ":%" MAX_SIGV4_LEN_TXT "s",
               provider0, provider1, region, service);
  if(!provider0[0]) {
    failf(data, "first provider can't be empty");
    ret = CURLE_BAD_FUNCTION_ARGUMENT;
    goto fail;
  }
  else if(!provider1[0])
    strcpy(provider1, provider0);

  if(!service[0]) {
    char *hostdot = strchr(hostname, '.');
    if(!hostdot) {
      failf(data, "service missing in parameters and hostname");
      ret = CURLE_URL_MALFORMAT;
      goto fail;
    }
    len = hostdot - hostname;
    if(len > MAX_SIGV4_LEN) {
      failf(data, "service too long in hostname");
      ret = CURLE_URL_MALFORMAT;
      goto fail;
    }
    strncpy(service, hostname, len);
    service[len] = '\0';

    if(!region[0]) {
      const char *reg = hostdot + 1;
      const char *hostreg = strchr(reg, '.');
      if(!hostreg) {
        failf(data, "region missing in parameters and hostname");
        ret = CURLE_URL_MALFORMAT;
        goto fail;
      }
      len = hostreg - reg;
      if(len > MAX_SIGV4_LEN) {
        failf(data, "region too long in hostname");
        ret = CURLE_URL_MALFORMAT;
        goto fail;
      }
      strncpy(region, reg, len);
      region[len] = '\0';
    }
  }

#ifdef DEBUGBUILD
  {
    char *force_timestamp = getenv("CURL_FORCETIME");
    if(force_timestamp)
      clock = 0;
    else
      time(&clock);
  }
#else
  time(&clock);
#endif
  ret = Curl_gmtime(clock, &tm);
  if(ret) {
    goto fail;
  }
  if(!strftime(timestamp, sizeof(timestamp), "%Y%m%dT%H%M%SZ", &tm)) {
    ret = CURLE_OUT_OF_MEMORY;
    goto fail;
  }

  ret = make_headers(data, hostname, timestamp, provider1,
                     &date_header, &canonical_headers, &signed_headers);
  if(ret)
    goto fail;
  ret = CURLE_OUT_OF_MEMORY;

  memcpy(date, timestamp, sizeof(date));
  date[sizeof(date) - 1] = 0;

  if(post_data) {
    if(data->set.postfieldsize < 0)
      post_data_len = strlen(post_data);
    else
      post_data_len = (size_t)data->set.postfieldsize;
  }
  if(Curl_sha256it(sha_hash, (const unsigned char *) post_data,
                   post_data_len))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash, sizeof(sha_hex));

  {
    Curl_HttpReq httpreq;
    const char *method;

    Curl_http_method(data, conn, &method, &httpreq);

    canonical_request =
      curl_maprintf("%s\n" /* HTTPRequestMethod */
                    "%s\n" /* CanonicalURI */
                    "%s\n" /* CanonicalQueryString */
                    "%s\n" /* CanonicalHeaders */
                    "%s\n" /* SignedHeaders */
                    "%s",  /* HashedRequestPayload in hex */
                    method,
                    data->state.up.path,
                    data->state.up.query ? data->state.up.query : "",
                    Curl_dyn_ptr(&canonical_headers),
                    Curl_dyn_ptr(&signed_headers),
                    sha_hex);
    if(!canonical_request)
      goto fail;
  }

  /* provider 0 lowercase */
  Curl_strntolower(provider0, provider0, strlen(provider0));
  request_type = curl_maprintf("%s4_request", provider0);
  if(!request_type)
    goto fail;

  credential_scope = curl_maprintf("%s/%s/%s/%s",
                                   date, region, service, request_type);
  if(!credential_scope)
    goto fail;

  if(Curl_sha256it(sha_hash, (unsigned char *) canonical_request,
                   strlen(canonical_request)))
    goto fail;

  sha256_to_hex(sha_hex, sha_hash, sizeof(sha_hex));

  /* provider 0 uppercase */
  Curl_strntoupper(provider0, provider0, strlen(provider0));

  /*
   * Google allows using RSA key instead of HMAC, so this code might change
   * in the future. For now we ony support HMAC.
   */
  str_to_sign = curl_maprintf("%s4-HMAC-SHA256\n" /* Algorithm */
                              "%s\n" /* RequestDateTime */
                              "%s\n" /* CredentialScope */
                              "%s",  /* HashedCanonicalRequest in hex */
                              provider0,
                              timestamp,
                              credential_scope,
                              sha_hex);
  if(!str_to_sign) {
    goto fail;
  }

  /* provider 0 uppercase */
  secret = curl_maprintf("%s4%s", provider0,
                         data->state.aptr.passwd ?
                         data->state.aptr.passwd : "");
  if(!secret)
    goto fail;

  HMAC_SHA256(secret, strlen(secret), date, strlen(date), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), region, strlen(region), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), service, strlen(service), sign0);
  HMAC_SHA256(sign0, sizeof(sign0), request_type, strlen(request_type), sign1);
  HMAC_SHA256(sign1, sizeof(sign1), str_to_sign, strlen(str_to_sign), sign0);

  sha256_to_hex(sha_hex, sign0, sizeof(sha_hex));

  /* provider 0 uppercase */
  auth_headers = curl_maprintf("Authorization: %s4-HMAC-SHA256 "
                               "Credential=%s/%s, "
                               "SignedHeaders=%s, "
                               "Signature=%s\r\n"
                               "%s\r\n",
                               provider0,
                               user,
                               credential_scope,
                               Curl_dyn_ptr(&signed_headers),
                               sha_hex,
                               date_header);
  if(!auth_headers) {
    goto fail;
  }

  Curl_safefree(data->state.aptr.userpwd);
  data->state.aptr.userpwd = auth_headers;
  data->state.authhost.done = TRUE;
  ret = CURLE_OK;

fail:
  Curl_dyn_free(&canonical_headers);
  Curl_dyn_free(&signed_headers);
  free(canonical_request);
  free(request_type);
  free(credential_scope);
  free(str_to_sign);
  free(secret);
  free(date_header);
  return ret;
}